

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::precomputeWordVectors(FastText *this,DenseMatrix *wordVectors)

{
  int32_t iVar1;
  element_type *this_00;
  string *in_RSI;
  Vector *in_RDI;
  FastText *unaff_retaddr;
  real norm;
  string word;
  int32_t i;
  Vector vec;
  undefined4 in_stack_ffffffffffffffa0;
  real in_stack_ffffffffffffffa4;
  Dictionary *in_stack_ffffffffffffffa8;
  DenseMatrix *in_stack_ffffffffffffffb0;
  int64_t in_stack_ffffffffffffffb8;
  Vector *in_stack_ffffffffffffffc0;
  int local_38;
  Vector *vec_00;
  
  vec_00 = in_RDI;
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x17255d);
  Vector::Vector(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  DenseMatrix::zero((DenseMatrix *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  local_38 = 0;
  while( true ) {
    this_00 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x172595);
    iVar1 = Dictionary::nwords(this_00);
    if (iVar1 <= local_38) break;
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1725c1);
    Dictionary::getWord_abi_cxx11_(in_stack_ffffffffffffffa8,(int32_t)in_stack_ffffffffffffffa4);
    getWordVector(unaff_retaddr,vec_00,in_RSI);
    in_stack_ffffffffffffffa4 = Vector::norm((Vector *)in_stack_ffffffffffffffb0);
    if (0.0 < in_stack_ffffffffffffffa4) {
      DenseMatrix::addVectorToRow
                (in_stack_ffffffffffffffb0,(Vector *)in_stack_ffffffffffffffa8,
                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (real)((ulong)in_RDI >> 0x20));
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    local_38 = local_38 + 1;
  }
  Vector::~Vector((Vector *)0x172698);
  return;
}

Assistant:

void FastText::precomputeWordVectors(DenseMatrix& wordVectors) {
  Vector vec(args_->dim);
  wordVectors.zero();
  for (int32_t i = 0; i < dict_->nwords(); i++) {
    std::string word = dict_->getWord(i);
    getWordVector(vec, word);
    real norm = vec.norm();
    if (norm > 0) {
      wordVectors.addVectorToRow(vec, i, 1.0 / norm);
    }
  }
}